

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.c
# Opt level: O2

int encode_with_recode_loop_and_filter
              (AV1_COMP *cpi,size_t *size,uint8_t *dest,size_t dest_size,int64_t *sse,int64_t *rate,
              int *largest_tile_id)

{
  YV12_BUFFER_CONFIG *scaled;
  CommonQuantParams *quant_params;
  int16_t *piVar1;
  AQ_MODE AVar2;
  _Bool _Var3;
  RECODE_LOOP_TYPE RVar4;
  int iVar5;
  AV1_PRIMARY *pAVar6;
  AV1LevelInfo *pAVar7;
  SequenceHeader *pSVar8;
  aom_transfer_characteristics_t aVar9;
  size_t *psVar10;
  int64_t *piVar11;
  DECODER_MODEL_STATUS DVar12;
  uint16_t uVar13;
  int iVar14;
  uint uVar15;
  int iVar16;
  int iVar17;
  long lVar18;
  YV12_BUFFER_CONFIG *pYVar19;
  RefCntBuffer *pRVar20;
  AV1_PRIMARY *pAVar21;
  long lVar22;
  uint8_t *memblk;
  int64_t iVar23;
  int *piVar24;
  uint uVar25;
  int iVar26;
  long lVar27;
  int plane;
  uint uVar28;
  uint uVar29;
  ulong uVar30;
  ulong uVar31;
  InterpFilter filter;
  byte bVar32;
  InterpFilter IVar33;
  segmentation *psVar34;
  AV1_COMMON *pAVar35;
  bool bVar36;
  double dVar37;
  double dVar38;
  uint local_174;
  uint local_170;
  int top_index;
  AV1_COMMON *local_168;
  ulong local_160;
  int bottom_index_1;
  int undershoot_seen;
  int overshoot_seen;
  ulong local_148;
  int local_13c;
  MACROBLOCKD *local_138;
  size_t *local_130;
  int bottom_index;
  int64_t *local_120;
  long *local_118;
  segmentation *local_110;
  uint8_t *local_108;
  size_t local_100;
  MV_STATS *local_f8;
  YV12_BUFFER_CONFIG *local_f0;
  CommonQuantParams *local_e8;
  EncQuantDequantParams *local_e0;
  YV12_BUFFER_CONFIG *local_d8;
  int frame_over_shoot_limit;
  undefined4 uStack_cc;
  uint64_t local_b0;
  
  for (lVar18 = 0x26b65; lVar18 != 0x26b6f; lVar18 = lVar18 + 1) {
    *(undefined4 *)((long)((cpi->enc_quant_dequant_params).quants.y_quant + -1) + lVar18 * 4) = 0;
    piVar1 = (cpi->enc_quant_dequant_params).quants.y_quant[1] + lVar18 * 2 + 4;
    piVar1[0] = 0;
    piVar1[1] = 0;
    piVar1 = (cpi->enc_quant_dequant_params).quants.y_quant[4] + lVar18 * 2;
    piVar1[0] = 0;
    piVar1[1] = 0;
    piVar1 = (cpi->enc_quant_dequant_params).quants.y_quant[6] + lVar18 * 2 + 4;
    piVar1[0] = 0;
    piVar1[1] = 0;
  }
  cpi->do_update_vbr_bits_off_target_fast = 0;
  local_168 = &cpi->common;
  local_130 = size;
  local_120 = sse;
  local_118 = rate;
  local_108 = dest;
  local_100 = dest_size;
  if ((cpi->sf).hl_sf.recode_loop != '\0') {
    set_size_independent_vars(cpi);
    if ((AOM_RC_FIRST_PASS < (cpi->oxcf).pass) &&
       ((cpi->sf).interp_sf.adaptive_interp_filter_search != 0)) {
      uVar13 = av1_setup_interp_filter_search_mask(cpi);
      (cpi->interp_search_flags).interp_filter_search_mask = uVar13;
    }
    av1_setup_frame_size(cpi);
    iVar14 = av1_superres_in_recode_allowed(cpi);
    if (((iVar14 != 0) && (cpi->superres_mode != AOM_SUPERRES_NONE)) &&
       ((cpi->common).superres_scale_denominator == '\b')) {
      if (sse != (int64_t *)0x0) {
        *sse = 0x7fffffffffffffff;
      }
      if (rate != (int64_t *)0x0) {
        *rate = 0x7fffffffffffffff;
      }
      *largest_tile_id = 0;
      return 0;
    }
    top_index = 0;
    bottom_index = 0;
    local_174 = 0;
    av1_set_size_dependent_vars(cpi,(int *)&local_174,&bottom_index,&top_index);
    uVar29 = bottom_index;
    local_160 = (ulong)(uint)top_index;
    av1_set_mv_search_params(cpi);
    allocate_gradient_info_for_hog(cpi);
    allocate_src_var_of_4x4_sub_block_buf(cpi);
    if ((cpi->sf).part_sf.partition_search_type == '\x02') {
      variance_partition_alloc(cpi);
    }
    pAVar35 = local_168;
    if ((local_168->current_frame).frame_type == '\0') {
      copy_frame_prob_info(cpi);
    }
    if (((cpi->sf).hl_sf.disable_extra_sc_testing == 0) && (cpi->use_ducky_encode == 0)) {
      av1_determine_sc_tools_with_encoding(cpi,local_174);
    }
    cpi->num_frame_recode = 0;
    overshoot_seen = 0;
    undershoot_seen = 0;
    local_d8 = &cpi->scaled_source;
    local_f0 = &cpi->scaled_last_source;
    local_e0 = &cpi->enc_quant_dequant_params;
    local_e8 = &(cpi->common).quant_params;
    local_110 = &(cpi->common).seg;
    local_f8 = &cpi->mv_stats;
    local_13c = 0;
    uVar28 = 0;
    uVar15 = 0;
    do {
      psVar10 = local_130;
      if (((uVar28 != 0) && (pYVar19 = cpi->source, pYVar19 != (YV12_BUFFER_CONFIG *)0x0)) &&
         (((cpi->gm_info).search_done == true &&
          (((pYVar19->field_2).field_0.y_crop_width != (cpi->common).width ||
           ((pYVar19->field_3).field_0.y_crop_height != (cpi->common).height)))))) {
        (cpi->gm_info).search_done = false;
      }
      pYVar19 = av1_realloc_and_scale_if_required
                          (pAVar35,cpi->unscaled_source,local_d8,EIGHTTAP_REGULAR,0,false,false,
                           (cpi->oxcf).border_in_pixels,cpi->alloc_pyramid);
      cpi->source = pYVar19;
      if (cpi->unscaled_last_source != (YV12_BUFFER_CONFIG *)0x0) {
        pYVar19 = av1_realloc_and_scale_if_required
                            (pAVar35,cpi->unscaled_last_source,local_f0,EIGHTTAP_REGULAR,0,false,
                             false,(cpi->oxcf).border_in_pixels,cpi->alloc_pyramid);
        cpi->last_source = pYVar19;
      }
      if (((cpi->ppi->gf_group).frame_parallel_level[cpi->gf_frame_index] == 0) &&
         (((pAVar35->current_frame).frame_type & 0xfd) != 0)) {
        if (uVar28 != 0) {
          release_scaled_references(cpi);
        }
        av1_scale_references(cpi,EIGHTTAP_REGULAR,0,0);
      }
      if ((cpi->use_ducky_encode != 0) && ((cpi->ducky_encode_info).frame_info.qp_mode == '\x01')) {
        local_174 = (cpi->ducky_encode_info).frame_info.q_index;
        (cpi->common).delta_q_info.delta_q_present_flag =
             (cpi->ducky_encode_info).frame_info.delta_q_enabled;
      }
      av1_set_quantizer(pAVar35,(cpi->oxcf).q_cfg.qm_minlevel,(cpi->oxcf).q_cfg.qm_maxlevel,
                        local_174,(uint)(cpi->oxcf).q_cfg.enable_chroma_deltaq,
                        (uint)(cpi->oxcf).q_cfg.enable_hdr_deltaq,(cpi->oxcf).mode == '\x02',
                        (cpi->oxcf).tune_cfg.tuning);
      av1_set_speed_features_qindex_dependent(cpi,(cpi->oxcf).speed);
      av1_init_quantizer(local_e0,local_e8,((cpi->common).seq_params)->bit_depth,
                         (cpi->oxcf).algo_cfg.sharpness);
      av1_set_variance_partition_thresholds(cpi,local_174,0);
      if (uVar28 == 0) {
        av1_setup_frame(cpi);
      }
      else {
        pRVar20 = get_primary_ref_frame_buf(pAVar35);
        if (pRVar20 == (RefCntBuffer *)0x0) {
          av1_default_coef_probs(pAVar35);
          av1_setup_frame_contexts(pAVar35);
        }
      }
      psVar34 = local_110;
      AVar2 = (cpi->oxcf).q_cfg.aq_mode;
      if (AVar2 == '\x02') {
        av1_setup_in_frame_q_adj(cpi);
        psVar34 = local_110;
      }
      else if (AVar2 == '\x01') {
        av1_vaq_frame_setup(cpi);
      }
      if (psVar34->enabled == '\0') {
        memset(psVar34,0,0xac);
      }
      else if (((cpi->common).seg.update_data == '\0') &&
              (pRVar20 = (cpi->common).prev_frame, pRVar20 != (RefCntBuffer *)0x0)) {
        segfeatures_copy(psVar34,&pRVar20->seg);
        (cpi->common).seg.enabled = (((cpi->common).prev_frame)->seg).enabled;
      }
      else {
        av1_calculate_segdata(psVar34);
      }
      segfeatures_copy(&((cpi->common).cur_frame)->seg,psVar34);
      (((cpi->common).cur_frame)->seg).enabled = (cpi->common).seg.enabled;
      uVar25 = uVar15;
      if (((cpi->common).current_frame.frame_type & 0xfd) != 0) {
        av1_pick_and_set_high_precision_mv(cpi,local_174);
        _Var3 = (cpi->common).features.allow_high_precision_mv;
        uVar25 = (uint)_Var3;
        if ((uVar28 != 0) && (uVar25 = (uint)_Var3, uVar15 != _Var3)) {
          (cpi->gm_info).search_done = false;
        }
      }
      av1_encode_frame(cpi);
      _Var3 = cpi->do_frame_data_update;
      if ((cpi->mv_stats).valid != 0 && _Var3 == true) {
        local_f8->horz_text = 0;
        local_f8->vert_text = 0;
        local_f8->diag_text = 0;
        local_f8->valid = 0;
        local_f8->total_mv_rate = 0;
        local_f8->hp_total_mv_rate = 0;
        local_f8->lp_total_mv_rate = 0;
        local_f8->horz_text = 0;
        local_f8->mv_joint_count[2] = 0;
        local_f8->mv_joint_count[3] = 0;
        local_f8->last_bit_zero = 0;
        local_f8->last_bit_nonzero = 0;
        local_f8->intra_count = 0;
        local_f8->default_mvs = 0;
        local_f8->mv_joint_count[0] = 0;
        local_f8->mv_joint_count[1] = 0;
        local_f8->high_prec = 0;
        local_f8->q = 0;
        local_f8->order = 0;
        local_f8->inter_count = 0;
      }
      if (((cpi->sf).hl_sf.high_precision_mv_usage == '\0') &&
         ((((cpi->common).current_frame.frame_type & 0xfd) != 0 & _Var3 &
          ((cpi->ppi->gf_group).update_type[cpi->gf_frame_index] & 0xfe) != 4) == 1)) {
        av1_collect_mv_stats(cpi,local_174);
      }
      if ((((cpi->sf).hl_sf.recode_loop != '\0') && ((cpi->oxcf).rc_cfg.mode != AOM_Q)) ||
         ((cpi->oxcf).rc_cfg.min_cr != 0)) {
        av1_finalize_encoded_frame(cpi);
        frame_over_shoot_limit = 0;
        (cpi->rc).coefficient_size = 0;
        iVar14 = av1_pack_bitstream(cpi,local_108,local_100,psVar10,&frame_over_shoot_limit);
        if (iVar14 != 0) goto LAB_001a58cd;
        (cpi->rc).projected_frame_size = (int)*psVar10 << 3;
      }
      iVar14 = top_index;
      local_138 = (MACROBLOCKD *)CONCAT44(local_138._4_4_,uVar25);
      local_148 = CONCAT44(local_148._4_4_,bottom_index);
      pAVar6 = cpi->ppi;
      if (((cpi->rc).is_src_frame_alt_ref != 0) &&
         (pAVar35 = local_168, (cpi->rc).projected_frame_size < (cpi->rc).max_frame_bandwidth))
      goto LAB_001a53ae;
      uVar15 = (cpi->oxcf).rc_cfg.min_cr;
      if ((int)uVar15 < 1) {
LAB_001a45bc:
        if ((((pAVar6->level_params).keep_level_stats != 0) &&
            ((cpi->oxcf).pass != AOM_RC_FIRST_PASS)) && (cpi->compressor_stage != '\x01')) {
          pAVar21 = pAVar6;
          if (((local_168->current_frame).frame_type == '\0') &&
             ((pAVar6->gf_group).refbuf_state[cpi->gf_frame_index] == '\0')) {
            av1_init_level_info(cpi);
            pAVar21 = cpi->ppi;
          }
          uVar30 = (ulong)(pAVar21->level_params).target_seq_level_idx[0];
          if ((((uVar30 < 0x1c) &&
               (pAVar7 = (pAVar21->level_params).level_info[0],
               pAVar7->decoder_models[uVar30].status == '\0')) &&
              (DVar12 = av1_decoder_model_try_smooth_buf
                                  (cpi,(long)(cpi->rc).projected_frame_size,
                                   pAVar7->decoder_models + uVar30), (byte)(DVar12 - 5) < 2)) &&
             (uVar15 = (cpi->rc).worst_quality, (int)local_174 < (int)uVar15)) {
            local_174 = local_174 + 10;
            if ((int)uVar15 <= (int)local_174) {
              local_174 = uVar15;
            }
            uVar30 = (ulong)local_174;
            uVar15 = local_174;
            if ((int)local_174 <= (int)uVar29) {
              uVar15 = uVar29;
            }
            uVar29 = uVar15;
            if ((int)local_174 <= (int)local_160) {
              uVar30 = local_160 & 0xffffffff;
            }
            bVar36 = false;
            local_160 = uVar30;
            goto LAB_001a4aca;
          }
        }
        pAVar35 = local_168;
        if ((cpi->oxcf).rc_cfg.mode == AOM_Q) goto LAB_001a53ae;
        local_170 = local_174;
        frame_over_shoot_limit = 0;
        bottom_index_1 = 0;
        av1_rc_compute_frame_size_bounds
                  (cpi,(cpi->rc).this_frame_target,&bottom_index_1,&frame_over_shoot_limit);
        uVar30 = local_160;
        if (frame_over_shoot_limit == 0) {
          frame_over_shoot_limit = 1;
        }
        bVar32 = (local_168->current_frame).frame_type;
        uVar15 = (uint)local_160;
        if (bVar32 == 0) {
          iVar17 = (cpi->rc).projected_frame_size;
          iVar16 = (cpi->rc).max_frame_bandwidth;
          if (iVar16 <= iVar17 || (pAVar6->p_rc).this_key_frame_forced == 0) goto LAB_001a4763;
          lVar18 = cpi->ambient_err;
          pYVar19 = &((cpi->common).cur_frame)->buf;
          if (((cpi->common).seq_params)->use_highbitdepth == '\0') {
            lVar22 = aom_get_y_sse(cpi->source,pYVar19);
          }
          else {
            lVar22 = aom_highbd_get_y_sse(cpi->source,pYVar19);
          }
          lVar22 = lVar22 + (ulong)(lVar22 == 0);
          if (((lVar18 < lVar22) && ((cpi->rc).projected_frame_size <= frame_over_shoot_limit)) ||
             ((lVar27 = lVar18 >> 1, lVar27 < lVar22 &&
              ((cpi->rc).projected_frame_size <= bottom_index_1)))) {
            uVar30 = (ulong)(local_174 - 1);
            if ((int)(local_174 - 1) <= (int)uVar29) {
              uVar30 = (ulong)uVar29;
            }
            uVar25 = (uint)((lVar18 * (int)local_174) / lVar22);
            iVar14 = uVar29 + (int)uVar30;
LAB_001a49cf:
            local_174 = iVar14 >> 1;
            if ((int)uVar25 <= iVar14 >> 1) {
              local_174 = uVar25;
            }
          }
          else if ((lVar22 < lVar27) && (bottom_index_1 <= (cpi->rc).projected_frame_size)) {
            uVar29 = local_174 + 1;
            if ((int)uVar15 <= (int)(local_174 + 1)) {
              uVar29 = uVar15;
            }
            uVar25 = (uint)((lVar27 * (int)local_174) / lVar22);
            iVar14 = uVar29 + uVar15 + 1;
            goto LAB_001a49cf;
          }
LAB_001a4aa8:
          uVar15 = local_174;
          if ((int)(uint)uVar30 <= (int)local_174) {
            uVar15 = (uint)uVar30;
          }
          bVar36 = (int)local_174 < (int)uVar29;
          local_160 = uVar30;
          local_174 = uVar15;
          if (bVar36) {
            local_174 = uVar29;
          }
        }
        else {
          iVar17 = (cpi->rc).projected_frame_size;
          iVar16 = (cpi->rc).max_frame_bandwidth;
LAB_001a4763:
          uVar31 = local_160 & 0xffffffff;
          if ((int)uVar15 <= iVar14) {
            uVar31 = (ulong)(uint)iVar14;
          }
          if (iVar17 < iVar16) {
            RVar4 = (cpi->sf).hl_sf.recode_loop;
            if ((RVar4 == '\x02') ||
               (RVar4 == '\x01' &&
                ((bVar32 & 0xfd) == 0 ||
                ((cpi->ppi->gf_group).update_type[cpi->gf_frame_index] & 0xfe) == 2)))
            goto LAB_001a47cb;
          }
          else {
LAB_001a47cb:
            if (((frame_over_shoot_limit < iVar17) && ((int)local_174 < (int)uVar31)) ||
               ((uVar31 = CONCAT71((int7)(uVar31 >> 8),(int)local_148 < (int)local_174),
                iVar17 < bottom_index_1 && (int)local_148 < (int)local_174 ||
                ((((cpi->oxcf).rc_cfg.mode == AOM_CQ &&
                  ((cpi->oxcf).rc_cfg.cq_level < (int)local_174)) &&
                 (uVar31 = (long)(cpi->rc).this_frame_target * 7 >> 3, (long)iVar17 < (long)uVar31))
                )))) {
              if ((cpi->rc).this_frame_target < iVar17) {
                iVar26 = bottom_index_1;
                if ((iVar16 <= iVar17) && (local_174 == uVar15)) {
                  dVar37 = av1_convert_qindex_to_q(uVar15,((cpi->common).seq_params)->bit_depth);
                  uVar29 = av1_find_qindex(dVar37 * ((double)(cpi->rc).projected_frame_size /
                                                    (double)(cpi->rc).max_frame_bandwidth),
                                           ((cpi->common).seq_params)->bit_depth,
                                           (cpi->rc).best_quality,(cpi->rc).worst_quality);
                  uVar30 = (ulong)uVar29;
                }
                uVar15 = (uint)uVar30;
                uVar29 = local_174 + 1;
                if ((int)uVar15 <= (int)(local_174 + 1)) {
                  uVar29 = uVar15;
                }
                if ((uVar28 < 3) && (undershoot_seen == 0)) {
                  if (uVar28 == 2) {
                    if (((local_168->current_frame).frame_type & 0xfd) != 0) goto LAB_001a487d;
                    local_160 = (long)(int)(uVar29 + uVar15 + 1) / 2 & 0xffffffff;
                    iVar14 = get_regulated_q_overshoot
                                       (cpi,uVar29,uVar15,iVar14,(int)local_148,iVar26);
                    local_174 = (iVar14 + (int)local_160 + 1) / 2;
                  }
                  else {
                    local_174 = get_regulated_q_overshoot
                                          (cpi,uVar29,uVar15,iVar14,(int)local_148,iVar26);
                  }
                }
                else {
LAB_001a487d:
                  av1_rc_update_rate_correction_factors
                            (cpi,1,(cpi->common).width,(cpi->common).height);
                  local_174 = (int)(uVar29 + uVar15 + 1) / 2;
                }
                piVar24 = &overshoot_seen;
              }
              else {
                uVar30 = (ulong)(local_174 - 1);
                if ((int)(local_174 - 1) <= (int)uVar29) {
                  uVar30 = (ulong)uVar29;
                }
                iVar17 = (int)uVar30;
                if ((uVar28 < 3) && (overshoot_seen == 0)) {
                  if (uVar28 == 2) {
                    if ((bVar32 & 0xfd) != 0) goto LAB_001a48cf;
                    uVar15 = get_regulated_q_undershoot
                                       (cpi,iVar17,iVar14,(int)local_148,(int)uVar31);
                    iVar14 = uVar15 - uVar29;
                    local_174 = (int)((int)(uVar29 + iVar17) / 2 + uVar15) / 2;
                  }
                  else {
                    uVar15 = get_regulated_q_undershoot
                                       (cpi,iVar17,iVar14,(int)local_148,(int)uVar31);
                    iVar14 = uVar15 - uVar29;
                    local_174 = uVar15;
                  }
                  uVar25 = local_174;
                  if (SBORROW4(uVar15,uVar29) == iVar14 < 0) {
                    uVar25 = uVar29;
                  }
                  if ((cpi->oxcf).rc_cfg.mode != AOM_CQ) {
                    uVar25 = uVar29;
                  }
                }
                else {
LAB_001a48cf:
                  av1_rc_update_rate_correction_factors
                            (cpi,1,(cpi->common).width,(cpi->common).height);
                  local_174 = (int)(uVar29 + iVar17) / 2;
                  uVar25 = uVar29;
                }
                uVar29 = uVar25;
                piVar24 = &undershoot_seen;
              }
              *piVar24 = 1;
              goto LAB_001a4aa8;
            }
          }
        }
        bVar36 = local_174 == local_170;
      }
      else {
        dVar37 = av1_get_compression_ratio(local_168,(long)((cpi->rc).projected_frame_size >> 3));
        dVar38 = (double)(int)uVar15 / 100.0;
        pAVar35 = local_168;
        if (dVar38 <= dVar37) {
          bVar36 = local_13c == 0;
          local_13c = 0;
          if (bVar36) goto LAB_001a45bc;
          goto LAB_001a53ae;
        }
        uVar15 = (cpi->rc).worst_quality;
        if ((int)uVar15 <= (int)local_174) goto LAB_001a53ae;
        dVar38 = dVar38 / dVar37;
        uVar25 = (uint)((double)(int)local_174 * dVar38 * dVar38);
        if ((int)uVar25 <= (int)local_174) {
          uVar25 = local_174 + 1;
        }
        if ((int)(local_174 + 0x20) <= (int)uVar25) {
          uVar25 = local_174 + 0x20;
        }
        local_174 = uVar25;
        if ((int)uVar15 <= (int)uVar25) {
          local_174 = uVar15;
        }
        if ((int)uVar29 < (int)local_174) {
          uVar29 = local_174;
        }
        uVar30 = local_160 & 0xffffffff;
        if ((int)local_160 < (int)local_174) {
          uVar30 = (ulong)local_174;
        }
        bVar36 = false;
        local_13c = 1;
        local_160 = uVar30;
      }
LAB_001a4aca:
      pAVar35 = local_168;
      if ((cpi->use_ducky_encode != 0) || (bVar36)) goto LAB_001a53ae;
      uVar28 = uVar28 + 1;
      iVar14 = cpi->num_frame_recode + 1;
      if (8 < cpi->num_frame_recode) {
        iVar14 = 9;
      }
      cpi->num_frame_recode = iVar14;
      uVar15 = (uint)local_138;
    } while( true );
  }
  iVar17 = is_frame_resize_pending(cpi);
  frame_over_shoot_limit = 0;
  bottom_index_1 = 0;
  top_index = 0;
  iVar14 = 0;
  if (cpi->ppi->use_svc == 0) {
    IVar33 = EIGHTTAP_SMOOTH;
  }
  else {
    iVar14 = (cpi->svc).spatial_layer_id;
    IVar33 = (cpi->svc).downsample_filter_type[iVar14];
    iVar14 = (cpi->svc).downsample_filter_phase[iVar14];
  }
  pYVar19 = cpi->unscaled_source;
  if (((cpi->rc).postencode_drop != 0) && (iVar16 = allow_postencode_drop_rtc(cpi), iVar16 != 0)) {
    av1_save_all_coding_context(cpi);
  }
  set_size_independent_vars(cpi);
  av1_setup_frame_size(cpi);
  pRVar20 = get_primary_ref_frame_buf(local_168);
  (cpi->common).prev_frame = pRVar20;
  av1_set_size_dependent_vars(cpi,&top_index,&bottom_index_1,&frame_over_shoot_limit);
  av1_set_mv_search_params(cpi);
  if (((cpi->common).current_frame.frame_number == 0) &&
     (((cpi->ppi->use_svc != 0 || (0 < (cpi->oxcf).rc_cfg.drop_frames_water_mark)) &&
      ((cpi->svc).temporal_layer_id == 0)))) {
    pSVar8 = (cpi->common).seq_params;
    iVar16 = aom_alloc_frame_buffer
                       (&(cpi->svc).source_last_TL0,(cpi->oxcf).frm_dim_cfg.width,
                        (cpi->oxcf).frm_dim_cfg.height,pSVar8->subsampling_x,pSVar8->subsampling_y,
                        (uint)pSVar8->use_highbitdepth,(cpi->oxcf).border_in_pixels,
                        (cpi->common).features.byte_alignment,false,0);
    if (iVar16 != 0) {
      aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                         "Failed to allocate buffer for source_last_TL0");
    }
  }
  filter = IVar33;
  if (cpi->ppi->use_svc == 0) {
    iVar14 = 8;
    iVar16 = (cpi->common).width;
    iVar26 = (pYVar19->field_2).field_0.y_crop_width;
    if ((iVar16 * 2 == iVar26) &&
       (iVar5 = (cpi->common).height, iVar5 * 2 == (pYVar19->field_3).field_0.y_crop_height)) {
      filter = (0xe100 < iVar5 * iVar16) * '\x02' + EIGHTTAP_SMOOTH;
    }
    else if (((iVar16 << 2 != iVar26) ||
             (filter = EIGHTTAP_SMOOTH,
             (cpi->common).height << 2 != (pYVar19->field_3).field_0.y_crop_height)) &&
            ((filter = IVar33, iVar16 << 2 == iVar26 * 3 &&
             ((cpi->common).height << 2 == (pYVar19->field_3).field_0.y_crop_height * 3)))) {
      filter = EIGHTTAP_REGULAR;
    }
  }
  allocate_gradient_info_for_hog(cpi);
  allocate_src_var_of_4x4_sub_block_buf(cpi);
  if ((cpi->sf).part_sf.partition_search_type == '\x02') {
    variance_partition_alloc(cpi);
  }
  if (((local_168->current_frame).frame_type == '\0') ||
     (((cpi->sf).inter_sf.extra_prune_warped != 0 && ((cpi->refresh_frame).golden_frame == true))))
  {
    copy_frame_prob_info(cpi);
  }
  scaled = &cpi->scaled_source;
  pYVar19 = av1_realloc_and_scale_if_required
                      (local_168,pYVar19,scaled,filter,iVar14,true,false,
                       (cpi->oxcf).border_in_pixels,cpi->alloc_pyramid);
  cpi->source = pYVar19;
  if ((((cpi->common).current_frame.frame_type & 0xfd) == 0) || (iVar17 != 0)) {
    iVar17 = (cpi->common).mi_params.mi_cols * (cpi->common).mi_params.mi_rows >> 2;
    memblk = cpi->consec_zero_mv;
    if (memblk == (uint8_t *)0x0) {
      memblk = (uint8_t *)0x0;
    }
    else if (cpi->consec_zero_mv_alloc_size < iVar17) {
      aom_free(memblk);
      cpi->consec_zero_mv_alloc_size = 0;
      memblk = (uint8_t *)aom_malloc((long)iVar17);
      cpi->consec_zero_mv = memblk;
      if (memblk == (uint8_t *)0x0) {
        aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                           "Failed to allocate cpi->consec_zero_mv");
        memblk = cpi->consec_zero_mv;
      }
      cpi->consec_zero_mv_alloc_size = iVar17;
    }
    memset(memblk,0,(long)iVar17);
  }
  if (cpi->scaled_last_source_available == 0) {
    if (cpi->unscaled_last_source != (YV12_BUFFER_CONFIG *)0x0) {
      pYVar19 = av1_realloc_and_scale_if_required
                          (local_168,cpi->unscaled_last_source,&cpi->scaled_last_source,filter,
                           iVar14,true,false,(cpi->oxcf).border_in_pixels,cpi->alloc_pyramid);
      cpi->last_source = pYVar19;
    }
  }
  else {
    cpi->last_source = &cpi->scaled_last_source;
    cpi->scaled_last_source_available = 0;
  }
  if ((cpi->sf).rt_sf.use_temporal_noise_estimate != 0) {
    av1_update_noise_estimate(cpi);
  }
  if ((cpi->svc).number_spatial_layers == 1) {
    uVar29 = cpi->ref_frame_flags;
    if (((uVar29 & 8) != 0 && (cpi->oxcf).superres_cfg.enable_superres == false) &&
       (((pYVar19 = get_ref_frame_yv12_buf(local_168,'\x04'), pYVar19 == (YV12_BUFFER_CONFIG *)0x0
         || ((pYVar19->field_2).field_0.y_crop_width != (cpi->common).width)) ||
        ((pYVar19->field_3).field_0.y_crop_height != (cpi->common).height)))) {
      uVar29 = uVar29 & 0xfffffff7;
      cpi->ref_frame_flags = uVar29;
    }
    if (((uVar29 & 0x40) != 0) &&
       (((pYVar19 = get_ref_frame_yv12_buf(local_168,'\a'), pYVar19 == (YV12_BUFFER_CONFIG *)0x0 ||
         ((pYVar19->field_2).field_0.y_crop_width != (cpi->common).width)) ||
        ((pYVar19->field_3).field_0.y_crop_height != (cpi->common).height)))) {
      cpi->ref_frame_flags = uVar29 & 0xffffffbf;
    }
  }
  pAVar35 = local_168;
  if (((cpi->ppi->gf_group).frame_parallel_level[cpi->gf_frame_index] == 0) &&
     (((local_168->current_frame).frame_type & 0xfd) != 0)) {
    av1_scale_references(cpi,filter,iVar14,1);
  }
  av1_set_quantizer(pAVar35,(cpi->oxcf).q_cfg.qm_minlevel,(cpi->oxcf).q_cfg.qm_maxlevel,top_index,
                    (uint)(cpi->oxcf).q_cfg.enable_chroma_deltaq,
                    (uint)(cpi->oxcf).q_cfg.enable_hdr_deltaq,(cpi->oxcf).mode == '\x02',
                    (cpi->oxcf).tune_cfg.tuning);
  av1_set_speed_features_qindex_dependent(cpi,(cpi->oxcf).speed);
  quant_params = &(cpi->common).quant_params;
  av1_init_quantizer(&cpi->enc_quant_dequant_params,quant_params,
                     ((cpi->common).seq_params)->bit_depth,(cpi->oxcf).algo_cfg.sharpness);
  av1_set_variance_partition_thresholds(cpi,top_index,0);
  av1_setup_frame(cpi);
  if ((((cpi->sf).rt_sf.overshoot_detection_cbr == '\x01') && ((cpi->rc).high_source_sad != 0)) &&
     (iVar14 = av1_encodedframe_overshoot_cbr(cpi,&top_index), iVar14 != 0)) {
    av1_set_quantizer(local_168,(cpi->oxcf).q_cfg.qm_minlevel,(cpi->oxcf).q_cfg.qm_maxlevel,
                      top_index,(uint)(cpi->oxcf).q_cfg.enable_chroma_deltaq,
                      (uint)(cpi->oxcf).q_cfg.enable_hdr_deltaq,(cpi->oxcf).mode == '\x02',
                      (cpi->oxcf).tune_cfg.tuning);
    av1_set_speed_features_qindex_dependent(cpi,(cpi->oxcf).speed);
    av1_init_quantizer(&cpi->enc_quant_dequant_params,quant_params,
                       ((cpi->common).seq_params)->bit_depth,(cpi->oxcf).algo_cfg.sharpness);
    av1_set_variance_partition_thresholds(cpi,top_index,0);
    if (((((cpi->common).current_frame.frame_type & 0xfd) == 0) ||
        ((cpi->common).features.error_resilient_mode != false)) ||
       ((cpi->common).features.primary_ref_frame == 7)) {
      av1_setup_frame(cpi);
    }
  }
  av1_apply_active_map(cpi);
  if ((cpi->oxcf).q_cfg.aq_mode == '\x03') {
    av1_cyclic_refresh_setup(cpi);
  }
  psVar34 = &(cpi->common).seg;
  if ((cpi->common).seg.enabled == '\0') {
    memset(psVar34,0,0xac);
  }
  else if (((cpi->common).seg.update_data == '\0') &&
          (pRVar20 = (cpi->common).prev_frame, pRVar20 != (RefCntBuffer *)0x0)) {
    segfeatures_copy(psVar34,&pRVar20->seg);
    (cpi->common).seg.enabled = (((cpi->common).prev_frame)->seg).enabled;
  }
  else {
    av1_calculate_segdata(psVar34);
  }
  segfeatures_copy(&((cpi->common).cur_frame)->seg,psVar34);
  (((cpi->common).cur_frame)->seg).enabled = (cpi->common).seg.enabled;
  iVar14 = is_psnr_calc_enabled(cpi);
  if ((iVar14 != 0) && ((cpi->sf).rt_sf.use_rtc_tf != 0)) {
    pSVar8 = (cpi->common).seq_params;
    pYVar19 = &cpi->orig_source;
    if ((cpi->orig_source).buffer_alloc_sz == 0) {
      iVar14 = (cpi->oxcf).frm_dim_cfg.width;
LAB_001a5195:
      iVar14 = aom_alloc_frame_buffer
                         (pYVar19,iVar14,(cpi->oxcf).frm_dim_cfg.height,pSVar8->subsampling_x,
                          pSVar8->subsampling_y,(uint)pSVar8->use_highbitdepth,
                          (cpi->oxcf).border_in_pixels,(cpi->common).features.byte_alignment,false,0
                         );
      if (iVar14 != 0) {
        aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                           "Failed to allocate scaled buffer");
      }
    }
    else {
      iVar17 = (cpi->rc).prev_coded_width;
      iVar14 = (cpi->oxcf).frm_dim_cfg.width;
      if ((iVar17 != iVar14) ||
         (iVar14 = iVar17, (cpi->rc).prev_coded_height != (cpi->oxcf).frm_dim_cfg.height))
      goto LAB_001a5195;
    }
    aom_yv12_copy_y_c(cpi->source,pYVar19,1);
    aom_yv12_copy_u_c(cpi->source,pYVar19,1);
    aom_yv12_copy_v_c(cpi->source,pYVar19,1);
  }
  pAVar35 = local_168;
  if (((local_168->current_frame).frame_type & 0xfd) != 0) {
    av1_pick_and_set_high_precision_mv(cpi,top_index);
  }
  av1_encode_frame(cpi);
  iVar14 = (cpi->rc).rtc_external_ratectrl;
  bVar32 = (cpi->common).current_frame.frame_type;
  if (iVar14 == 0) {
    if ((bVar32 & 0xfd) == 0) goto LAB_001a5395;
    iVar16 = ((cpi->rc).cnt_zeromv * 100) /
             ((cpi->common).mi_params.mi_cols * (cpi->common).mi_params.mi_rows);
    iVar17 = cpi->ppi->use_svc;
    if ((iVar17 == 0) ||
       (((cpi->svc).layer_context[(cpi->svc).temporal_layer_id].is_key_frame == 0 &&
        ((cpi->svc).spatial_layer_id == (cpi->svc).number_spatial_layers + -1)))) {
      iVar26 = (cpi->rc).avg_frame_low_motion;
      if (iVar26 != 0) {
        iVar16 = (iVar26 * 3 + iVar16) / 4;
      }
      (cpi->rc).avg_frame_low_motion = iVar16;
      if ((iVar17 != 0) &&
         (iVar17 = (cpi->svc).spatial_layer_id, iVar17 == (cpi->svc).number_spatial_layers + -1)) {
        iVar26 = 0;
        if (iVar17 < 1) {
          iVar17 = iVar26;
        }
        for (; iVar17 != iVar26; iVar26 = iVar26 + 1) {
          (cpi->svc).layer_context
          [(long)(cpi->svc).temporal_layer_id +
           (long)iVar26 * (long)(cpi->svc).number_temporal_layers].rc.avg_frame_low_motion = iVar16;
        }
      }
    }
  }
  else if ((bVar32 & 0xfd) == 0) goto LAB_001a5395;
  if (((((((cpi->oxcf).rc_cfg.mode == AOM_CBR) && ((cpi->oxcf).mode == '\x01')) &&
        ((cpi->svc).number_spatial_layers == 1)) &&
       ((iVar14 == 0 && ((cpi->svc).number_temporal_layers == 1)))) &&
      ((cpi->ppi->rtc_ref).set_ref_frame_config == 0)) &&
     ((cpi->sf).rt_sf.gf_refresh_based_on_qp != 0)) {
    av1_adjust_gf_refresh_qp_one_pass_rt(cpi);
  }
LAB_001a5395:
  if ((((1 < (cpi->common).current_frame.frame_number) && (cpi->ppi->use_svc == 0)) &&
      (((cpi->scaled_source).field_5.field_0.y_buffer != (uint8_t *)0x0 &&
       ((((cpi->scaled_last_source).field_5.field_0.y_buffer != (uint8_t *)0x0 &&
         ((cpi->scaled_source).field_2.field_0.y_crop_width ==
          (cpi->scaled_last_source).field_2.field_0.y_crop_width)) &&
        ((cpi->scaled_source).field_3.field_0.y_crop_height ==
         (cpi->scaled_last_source).field_3.field_0.y_crop_height)))))) &&
     (((cpi->common).width != (cpi->unscaled_source->field_2).field_0.y_crop_width ||
      ((cpi->common).height != (cpi->unscaled_source->field_3).field_0.y_crop_height)))) {
    pYVar19 = &cpi->scaled_last_source;
    cpi->scaled_last_source_available = 1;
    aom_yv12_copy_y_c(scaled,pYVar19,1);
    aom_yv12_copy_u_c(scaled,pYVar19,1);
    pAVar35 = local_168;
    aom_yv12_copy_v_c(scaled,pYVar19,1);
  }
LAB_001a53ae:
  pSVar8 = (cpi->common).seq_params;
  if (((cpi->ppi->p_rc).next_key_frame_forced != 0) && ((cpi->rc).frames_to_key == 1)) {
    pYVar19 = &((cpi->common).cur_frame)->buf;
    if (pSVar8->use_highbitdepth == '\0') {
      iVar23 = aom_get_y_sse(cpi->source,pYVar19);
    }
    else {
      iVar23 = aom_highbd_get_y_sse(cpi->source,pYVar19);
    }
    cpi->ambient_err = iVar23;
  }
  pRVar20 = (cpi->common).cur_frame;
  aVar9 = pSVar8->transfer_characteristics;
  (pRVar20->buf).color_primaries = pSVar8->color_primaries;
  (pRVar20->buf).transfer_characteristics = aVar9;
  (pRVar20->buf).matrix_coefficients = pSVar8->matrix_coefficients;
  (pRVar20->buf).monochrome = pSVar8->monochrome;
  (pRVar20->buf).chroma_sample_position = pSVar8->chroma_sample_position;
  (pRVar20->buf).color_range = pSVar8->color_range;
  iVar14 = (cpi->common).render_height;
  (pRVar20->buf).render_width = (cpi->common).render_width;
  (pRVar20->buf).render_height = iVar14;
  iVar14 = (cpi->mt_info).pipeline_lpf_mt_with_enc;
  if (iVar14 == 0) {
    (cpi->common).lf.filter_level[0] = 0;
    (cpi->common).lf.filter_level[1] = 0;
    (cpi->common).lf.backup_filter_level[0] = 0;
    (cpi->common).lf.backup_filter_level[1] = 0;
    (cpi->common).cdef_info.cdef_bits = 0;
    (cpi->common).cdef_info.nb_cdef_strengths = 1;
    (cpi->common).cdef_info.cdef_strengths[0] = 0;
    (cpi->common).cdef_info.cdef_uv_strengths[0] = 0;
    (cpi->common).rst_info[0].frame_restoration_type = RESTORE_NONE;
    (cpi->common).rst_info[1].frame_restoration_type = RESTORE_NONE;
    (cpi->common).rst_info[2].frame_restoration_type = RESTORE_NONE;
  }
  if ((cpi->common).features.allow_intrabc == false) {
    local_148 = (ulong)(uint)(cpi->mt_info).num_mod_workers[5];
    local_170 = CONCAT31(local_170._1_3_,((cpi->common).seq_params)->monochrome == '\0');
    (cpi->td).mb.rdmult = (cpi->rd).RDMULT;
    if ((cpi->common).features.coded_lossless == false) {
      bVar36 = iVar14 == 0 && (cpi->common).tiles.large_scale == 0;
    }
    else {
      bVar36 = false;
    }
    iVar14 = is_cdef_used(pAVar35);
    local_160 = CONCAT44(local_160._4_4_,iVar14);
    iVar14 = (cpi->common).width;
    iVar17 = (cpi->common).superres_upscaled_width;
    iVar16 = is_restoration_used(pAVar35);
    pAVar35 = local_168;
    if ((cpi->ppi->rtc_ref).non_reference_frame == 0) {
      bVar32 = 0;
      if (((((cpi->oxcf).algo_cfg.skip_postproc_filtering == true) &&
           (cpi->ppi->b_calculate_psnr == 0)) && (bVar32 = (iVar16 == 0) + 1, iVar16 == 0)) &&
         (iVar14 == iVar17)) {
        if ((int)local_160 == 0) {
          bVar32 = bVar36 << 3;
        }
        else {
          bVar32 = 4;
          if (bVar36 != false) {
            bVar32 = ((cpi->sf).lpf_sf.cdef_pick_method == CDEF_PICK_FROM_Q) * '\b' + 4;
          }
        }
      }
    }
    else {
      bVar32 = 0xc;
    }
    local_138 = &(cpi->td).mb.e_mbd;
    if (((bVar36 != false) &&
        ((av1_pick_filter_level(cpi->source,cpi,(cpi->sf).lpf_sf.lpf_pick),
         (cpi->common).lf.filter_level[0] != 0 || ((cpi->common).lf.filter_level[1] != 0)))) &&
       (bVar32 < 8)) {
      iVar14 = 0;
      if ((0 < (cpi->sf).tx_sf.inter_tx_size_search_init_depth_rect) &&
         (0 < (cpi->sf).tx_sf.inter_tx_size_search_init_depth_sqr)) {
        iVar14 = ((cpi->sf).lpf_sf.lpf_pick == '\x03') + 1;
      }
      av1_loop_filter_frame_mt
                (&((cpi->common).cur_frame)->buf,pAVar35,local_138,0,(local_170 & 0xff) * 2 + 1,0,
                 (cpi->mt_info).workers,(int)local_148,&(cpi->mt_info).lf_row_sync,iVar14);
    }
    if (iVar16 != 0) {
      av1_loop_restoration_save_boundary_lines(&((cpi->common).cur_frame)->buf,pAVar35,0);
    }
    if ((int)local_160 != 0) {
      iVar14 = (cpi->mt_info).num_mod_workers[7];
      av1_cdef_search(cpi);
      if ((bVar32 & 4) == 0) {
        if (iVar14 < 2) {
          av1_cdef_frame(&((cpi->common).cur_frame)->buf,pAVar35,local_138,av1_cdef_init_fb_row);
        }
        else {
          iVar17 = extend_borders_mt(cpi,MOD_CDEF,0);
          av1_cdef_frame_mt(pAVar35,local_138,(cpi->mt_info).cdef_worker,(cpi->mt_info).workers,
                            &(cpi->mt_info).cdef_sync,iVar14,av1_cdef_init_fb_row_mt,iVar17);
        }
      }
    }
    if (((bVar32 & 2) == 0) && ((cpi->common).width != (cpi->common).superres_upscaled_width)) {
      av1_superres_post_encode(cpi);
    }
    if (iVar16 != 0) {
      iVar14 = (cpi->mt_info).num_mod_workers[8];
      av1_loop_restoration_save_boundary_lines(&((cpi->common).cur_frame)->buf,pAVar35,1);
      av1_pick_filter_restoration(cpi->source,cpi);
      if (((bVar32 & 1) == 0) &&
         ((((cpi->common).rst_info[0].frame_restoration_type != RESTORE_NONE ||
           ((cpi->common).rst_info[1].frame_restoration_type != RESTORE_NONE)) ||
          ((cpi->common).rst_info[2].frame_restoration_type != RESTORE_NONE)))) {
        pYVar19 = &((cpi->common).cur_frame)->buf;
        if (iVar14 < 2) {
          av1_loop_restoration_filter_frame(pYVar19,pAVar35,0,&cpi->lr_ctxt);
        }
        else {
          av1_loop_restoration_filter_frame_mt
                    (pYVar19,pAVar35,0,(cpi->mt_info).workers,iVar14,&(cpi->mt_info).lr_row_sync,
                     &cpi->lr_ctxt,1);
        }
      }
    }
  }
  psVar10 = local_130;
  if (((cpi->oxcf).mode != '\x02') && ((cpi->ppi->rtc_ref).non_reference_frame == 0)) {
    for (uVar29 = 0; uVar29 < (uint)(((cpi->common).seq_params)->monochrome == '\0') * 2 + 1;
        uVar29 = uVar29 + 1) {
      iVar14 = extend_borders_mt(cpi,MOD_CDEF,uVar29);
      if ((iVar14 == 0) && (iVar14 = extend_borders_mt(cpi,MOD_LR,uVar29), iVar14 == 0)) {
        pRVar20 = (cpi->common).cur_frame;
        aom_extend_frame_borders_plane_row_c
                  (&pRVar20->buf,uVar29,0,
                   *(int *)((long)(pRVar20->buf).store_buf_adr + (ulong)(uVar29 != 0) * 4 + -0x30));
      }
    }
  }
  if ((cpi->oxcf).tune_cfg.content == AOM_CONTENT_FILM) {
    (cpi->common).film_grain_params.apply_grain = 1;
    (cpi->common).film_grain_params.update_parameters = 1;
    iVar14 = rand();
    (cpi->common).film_grain_params.random_seed = (uint16_t)iVar14;
    (cpi->common).film_grain_params.num_y_points = 1;
    (cpi->common).film_grain_params.scaling_points_y[0] = (int  [2])0x6400000080;
    bVar36 = ((cpi->common).seq_params)->monochrome == '\0';
    if (bVar36) {
      (cpi->common).film_grain_params.scaling_points_cb[0] = (int  [2])0x6400000080;
      (cpi->common).film_grain_params.scaling_points_cr[0] = (int  [2])0x6400000080;
    }
    uVar29 = (uint)bVar36;
    (cpi->common).film_grain_params.num_cb_points = uVar29;
    (cpi->common).film_grain_params.num_cr_points = uVar29;
    (cpi->common).film_grain_params.chroma_scaling_from_luma = 0;
    (cpi->common).film_grain_params.grain_scale_shift = 0;
    (cpi->common).film_grain_params.scaling_shift = 1;
    (cpi->common).film_grain_params.ar_coeff_lag = 0;
    (cpi->common).film_grain_params.ar_coeff_shift = 1;
    (cpi->common).film_grain_params.overlap_flag = 1;
  }
  av1_finalize_encoded_frame(cpi);
  (cpi->rc).coefficient_size = 0;
  iVar14 = av1_pack_bitstream(cpi,local_108,local_100,psVar10,largest_tile_id);
  if (iVar14 == 0) {
    if ((((cpi->rc).postencode_drop != 0) && (iVar14 = allow_postencode_drop_rtc(cpi), iVar14 != 0))
       && (iVar14 = av1_postencode_drop_cbr(cpi,psVar10), iVar14 != 0)) {
      return 0;
    }
    piVar11 = local_120;
    if (local_120 != (int64_t *)0x0) {
      pYVar19 = &((cpi->common).cur_frame)->buf;
      if (pSVar8->use_highbitdepth == '\0') {
        iVar23 = aom_get_y_sse(cpi->source,pYVar19);
      }
      else {
        iVar23 = aom_highbd_get_y_sse(cpi->source,pYVar19);
      }
      *piVar11 = iVar23;
    }
    if (local_118 != (long *)0x0) {
      *local_118 = *psVar10 << 8;
    }
    iVar14 = 0;
    if (cpi->use_ducky_encode != 0) {
      aom_calc_psnr(cpi->source,&((cpi->common).cur_frame)->buf,
                    (PSNR_STATS *)&frame_over_shoot_limit);
      (cpi->ducky_encode_info).frame_result.global_order_idx =
           ((cpi->common).cur_frame)->display_order_hint;
      (cpi->ducky_encode_info).frame_result.q_index = (cpi->common).quant_params.base_qindex;
      (cpi->ducky_encode_info).frame_result.rdmult = (cpi->rd).RDMULT;
      (cpi->ducky_encode_info).frame_result.rate = (int)*psVar10 << 3;
      (cpi->ducky_encode_info).frame_result.dist = local_b0;
      (cpi->ducky_encode_info).frame_result.psnr =
           (double)CONCAT44(uStack_cc,frame_over_shoot_limit);
    }
  }
  else {
LAB_001a58cd:
    iVar14 = 1;
  }
  return iVar14;
}

Assistant:

static int encode_with_recode_loop_and_filter(AV1_COMP *cpi, size_t *size,
                                              uint8_t *dest, size_t dest_size,
                                              int64_t *sse, int64_t *rate,
                                              int *largest_tile_id) {
#if CONFIG_COLLECT_COMPONENT_TIMING
  start_timing(cpi, encode_with_or_without_recode_time);
#endif
  for (int i = 0; i < NUM_RECODES_PER_FRAME; i++) {
    cpi->do_update_frame_probs_txtype[i] = 0;
    cpi->do_update_frame_probs_obmc[i] = 0;
    cpi->do_update_frame_probs_warp[i] = 0;
    cpi->do_update_frame_probs_interpfilter[i] = 0;
  }

  cpi->do_update_vbr_bits_off_target_fast = 0;
  int err;
#if CONFIG_REALTIME_ONLY
  err = encode_without_recode(cpi);
#else
  if (cpi->sf.hl_sf.recode_loop == DISALLOW_RECODE)
    err = encode_without_recode(cpi);
  else
    err = encode_with_recode_loop(cpi, size, dest, dest_size);
#endif
#if CONFIG_COLLECT_COMPONENT_TIMING
  end_timing(cpi, encode_with_or_without_recode_time);
#endif
  if (err != AOM_CODEC_OK) {
    if (err == -1) {
      // special case as described in encode_with_recode_loop().
      // Encoding was skipped.
      err = AOM_CODEC_OK;
      if (sse != NULL) *sse = INT64_MAX;
      if (rate != NULL) *rate = INT64_MAX;
      *largest_tile_id = 0;
    }
    return err;
  }

#ifdef OUTPUT_YUV_DENOISED
  const AV1EncoderConfig *const oxcf = &cpi->oxcf;
  if (oxcf->noise_sensitivity > 0 && denoise_svc(cpi)) {
    aom_write_yuv_frame(yuv_denoised_file,
                        &cpi->denoiser.running_avg_y[INTRA_FRAME]);
  }
#endif

  AV1_COMMON *const cm = &cpi->common;
  SequenceHeader *const seq_params = cm->seq_params;

  // Special case code to reduce pulsing when key frames are forced at a
  // fixed interval. Note the reconstruction error if it is the frame before
  // the force key frame
  if (cpi->ppi->p_rc.next_key_frame_forced && cpi->rc.frames_to_key == 1) {
#if CONFIG_AV1_HIGHBITDEPTH
    if (seq_params->use_highbitdepth) {
      cpi->ambient_err = aom_highbd_get_y_sse(cpi->source, &cm->cur_frame->buf);
    } else {
      cpi->ambient_err = aom_get_y_sse(cpi->source, &cm->cur_frame->buf);
    }
#else
    cpi->ambient_err = aom_get_y_sse(cpi->source, &cm->cur_frame->buf);
#endif
  }

  cm->cur_frame->buf.color_primaries = seq_params->color_primaries;
  cm->cur_frame->buf.transfer_characteristics =
      seq_params->transfer_characteristics;
  cm->cur_frame->buf.matrix_coefficients = seq_params->matrix_coefficients;
  cm->cur_frame->buf.monochrome = seq_params->monochrome;
  cm->cur_frame->buf.chroma_sample_position =
      seq_params->chroma_sample_position;
  cm->cur_frame->buf.color_range = seq_params->color_range;
  cm->cur_frame->buf.render_width = cm->render_width;
  cm->cur_frame->buf.render_height = cm->render_height;

  if (!cpi->mt_info.pipeline_lpf_mt_with_enc)
    set_postproc_filter_default_params(&cpi->common);

  if (!cm->features.allow_intrabc) {
    loopfilter_frame(cpi, cm);
  }

  if (cpi->oxcf.mode != ALLINTRA && !cpi->ppi->rtc_ref.non_reference_frame) {
    extend_frame_borders(cpi);
  }

#ifdef OUTPUT_YUV_REC
  aom_write_one_yuv_frame(cm, &cm->cur_frame->buf);
#endif

  if (cpi->oxcf.tune_cfg.content == AOM_CONTENT_FILM) {
    set_grain_syn_params(cm);
  }

  av1_finalize_encoded_frame(cpi);
  // Build the bitstream
#if CONFIG_COLLECT_COMPONENT_TIMING
  start_timing(cpi, av1_pack_bitstream_final_time);
#endif
  cpi->rc.coefficient_size = 0;
  if (av1_pack_bitstream(cpi, dest, dest_size, size, largest_tile_id) !=
      AOM_CODEC_OK)
    return AOM_CODEC_ERROR;
#if CONFIG_COLLECT_COMPONENT_TIMING
  end_timing(cpi, av1_pack_bitstream_final_time);
#endif

  if (cpi->rc.postencode_drop && allow_postencode_drop_rtc(cpi) &&
      av1_postencode_drop_cbr(cpi, size)) {
    return AOM_CODEC_OK;
  }

  // Compute sse and rate.
  if (sse != NULL) {
#if CONFIG_AV1_HIGHBITDEPTH
    *sse = (seq_params->use_highbitdepth)
               ? aom_highbd_get_y_sse(cpi->source, &cm->cur_frame->buf)
               : aom_get_y_sse(cpi->source, &cm->cur_frame->buf);
#else
    *sse = aom_get_y_sse(cpi->source, &cm->cur_frame->buf);
#endif
  }
  if (rate != NULL) {
    const int64_t bits = (*size << 3);
    *rate = (bits << 5);  // To match scale.
  }

#if !CONFIG_REALTIME_ONLY
  if (cpi->use_ducky_encode) {
    PSNR_STATS psnr;
    aom_calc_psnr(cpi->source, &cpi->common.cur_frame->buf, &psnr);
    DuckyEncodeFrameResult *frame_result = &cpi->ducky_encode_info.frame_result;
    frame_result->global_order_idx = cm->cur_frame->display_order_hint;
    frame_result->q_index = cm->quant_params.base_qindex;
    frame_result->rdmult = cpi->rd.RDMULT;
    frame_result->rate = (int)(*size) * 8;
    frame_result->dist = psnr.sse[0];
    frame_result->psnr = psnr.psnr[0];
  }
#endif  // !CONFIG_REALTIME_ONLY

  return AOM_CODEC_OK;
}